

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O0

void __thiscall
TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test::
~TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test
          (TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this)

{
  TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this_local;
  
  ~TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test(this);
  operator_delete(this,0x270);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionMapsAdditionalSpace) {
    using ::testing::ContainerEq;

    // The first connection write > min_region_size bytes in a transaction.
    std::vector<std::uint8_t> buffer1 (pstore::storage::min_region_size + 1);
    std::iota (std::begin (buffer1), std::end (buffer1), std::uint8_t{0});

    pstore::extent<std::uint8_t> t1;
    {
        auto transaction = pstore::begin (first);
        {
            t1.size = buffer1.size ();
            std::shared_ptr<std::uint8_t> ptr;
            std::tie (ptr, t1.addr) = transaction.alloc_rw<std::uint8_t> (t1.size);
            std::memcpy (ptr.get (), buffer1.data (), buffer1.size ());
        }

        transaction.commit ();
    }

    second.sync ();
    auto r = second.getro (t1);
    std::vector<std::uint8_t> buffer2 (r.get (), r.get () + t1.size);
    EXPECT_THAT (buffer2, ContainerEq (buffer1));
}